

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_arg * __thiscall
fmt::v5::
basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>
::get_arg(format_arg *__return_storage_ptr__,
         basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>
         *this,basic_string_view<fmt::v5::char8_t> name)

{
  unsigned_long_long local_38;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>_2
  aStack_30;
  
  local_38 = (this->
             super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>,_fmt::v5::char8_t>
             ).args_.types_;
  aStack_30 = (this->
              super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>,_fmt::v5::char8_t>
              ).args_.field_1;
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
  ::init(&this->map_,(EVP_PKEY_CTX *)&local_38);
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>,_fmt::v5::char8_t>_>
  ::find(__return_storage_ptr__,&this->map_,name);
  if (__return_storage_ptr__->type_ == none_type) {
    internal::error_handler::on_error((error_handler *)this,"argument not found");
  }
  return __return_storage_ptr__;
}

Assistant:

typename basic_format_context<Range, Char>::format_arg
  basic_format_context<Range, Char>::get_arg(
    basic_string_view<char_type> name) {
  map_.init(this->args());
  format_arg arg = map_.find(name);
  if (arg.type() == internal::none_type)
    this->on_error("argument not found");
  return arg;
}